

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

SpatialInertia * __thiscall
iDynTree::Transform::operator*
          (SpatialInertia *__return_storage_ptr__,Transform *this,SpatialInertia *op2)

{
  Rotation *this_00;
  double dVar1;
  SpatialInertia *pSVar2;
  ActualDstType actualDst;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Position newCenterOfMass;
  RotationalInertia newRotInertia;
  RotationalInertia oldRotInertiaWrtCom;
  assign_op<double,_double> local_211;
  SpatialInertia *local_210;
  undefined1 local_208 [16];
  Vector3d local_1f8;
  Position local_1d8;
  RotationalInertia local_1b8;
  Product<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_1>
  local_170;
  undefined1 local_140 [96];
  double local_e0;
  double *local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  RotationalInertia local_78;
  
  local_210 = __return_storage_ptr__;
  dVar1 = SpatialInertia::getMass(op2);
  local_208._8_4_ = extraout_XMM0_Dc;
  local_208._0_8_ = dVar1;
  local_208._12_4_ = extraout_XMM0_Dd;
  SpatialInertia::getCenterOfMass((Position *)&local_1b8,op2);
  this_00 = &this->rot;
  Rotation::operator*((Position *)local_140,this_00,(Position *)&local_1b8);
  Position::operator+(&local_1d8,(Position *)local_140,&this->pos);
  RotationalInertia::RotationalInertia(&local_1b8);
  SpatialInertia::getRotationalInertiaWrtCenterOfMass(&local_78,op2);
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_1d8.super_Vector3.m_data[0];
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_1d8.super_Vector3.m_data[1];
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_1d8.super_Vector3.m_data[2];
  squareCrossProductMatrix(&local_1f8);
  local_140._8_8_ = local_140 + 0x10;
  local_170.m_lhs.m_lhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this_00;
  local_170.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&local_78;
  local_170.m_rhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this_00;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>,1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_140._8_8_,&local_170,&local_211);
  pSVar2 = local_210;
  local_e0 = (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[0] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[0] - local_c8 * (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[1] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[1] - dStack_c0 * (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[2] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[2] - local_b8 * (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[3] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[3] - dStack_b0 * (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[4] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[4] - local_a8 * (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[5] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[5] - dStack_a0 * (double)local_208._0_8_;
  local_1b8.super_Matrix3x3.m_data[6] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[6] - (double)local_208._0_8_ * local_98;
  local_1b8.super_Matrix3x3.m_data[7] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[7] - (double)local_208._0_8_ * dStack_90;
  local_1b8.super_Matrix3x3.m_data[8] =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_140._8_8_)->m_storage).
       m_data.array[8] - local_88 * (double)local_208._0_8_;
  local_d0 = &local_c8;
  SpatialInertia::SpatialInertia(local_210,(double)local_208._0_8_,&local_1d8,&local_1b8);
  return pSVar2;
}

Assistant:

SpatialInertia Transform::operator*(const SpatialInertia& op2) const
{
    return transform<SpatialInertia>(*this,op2);
}